

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_23::IsNonMessageType(anon_unknown_23 *this,string_view type)

{
  initializer_list<const_char_*> iVar1;
  bool bVar2;
  int iVar3;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_bb;
  key_equal local_ba;
  hasher local_b9;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  iterator local_38;
  size_type local_30;
  undefined1 local_18 [8];
  string_view type_local;
  
  type_local._M_len = type._M_len;
  local_18 = (undefined1  [8])this;
  if ((anonymous_namespace)::IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)::
      non_message_types == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)
                                 ::non_message_types,type_local._M_len,type._M_str);
    if (iVar3 != 0) {
      this_00 = (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)operator_new(0x20);
      local_48 = "sint32";
      pcStack_40 = "sint64";
      local_58 = "sfixed32";
      pcStack_50 = "sfixed64";
      local_68 = "uint32";
      pcStack_60 = "enum";
      local_78 = "string";
      pcStack_70 = "bytes";
      local_88 = "fixed64";
      pcStack_80 = "bool";
      local_98 = "int32";
      pcStack_90 = "fixed32";
      local_a8 = "int64";
      pcStack_a0 = "uint64";
      local_b8 = "double";
      pcStack_b0 = "float";
      local_38 = &local_b8;
      local_30 = 0x10;
      std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_bb);
      iVar1._M_len = local_30;
      iVar1._M_array = local_38;
      absl::lts_20240722::
      flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::raw_hash_set(this_00,iVar1,0,&local_b9,&local_ba,&local_bb);
      std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_bb);
      IsNonMessageType::non_message_types = this_00;
      __cxa_guard_release(&(anonymous_namespace)::
                           IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)::
                           non_message_types);
    }
  }
  bVar2 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::contains<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)IsNonMessageType::non_message_types,
                     (key_arg<std::basic_string_view<char>_> *)local_18);
  return bVar2;
}

Assistant:

bool IsNonMessageType(absl::string_view type) {
  static const auto* non_message_types =
      new absl::flat_hash_set<absl::string_view>(
          {"double", "float", "int64", "uint64", "int32", "fixed32", "fixed64",
           "bool", "string", "bytes", "uint32", "enum", "sfixed32", "sfixed64",
           "sint32", "sint64"});
  return non_message_types->contains(type);
}